

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::insert_into_linear<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
          (hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
           *this,transaction_base *transaction,index_pointer node,
          pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *value,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  linear_node *plVar1;
  bool bVar2;
  database *pdVar3;
  address aVar4;
  type this_00;
  address *paVar5;
  pointer l;
  array_stack<pstore::index::details::parent_type,_13UL> *paVar6;
  undefined8 extraout_RDX;
  pair<pstore::index::details::index_pointer,_bool> pVar7;
  parent_type local_158;
  value_type local_148;
  index_pointer local_140;
  parent_type local_138;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_128;
  value_type local_120;
  undefined1 local_118 [16];
  linear_node *lnode;
  unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
  new_node_1;
  undefined1 local_f0 [8];
  unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
  new_node;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> local_d0;
  size_t local_c0;
  size_t index;
  index_pointer child_slot;
  array_stack<pstore::index::details::parent_type,_13UL> *local_90;
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  local_88;
  linear_node *local_70;
  linear_node *orig_node;
  shared_ptr<const_pstore::index::details::linear_node> lptr;
  index_pointer iStack_50;
  bool key_exists;
  index_pointer result;
  pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *ppStack_40;
  bool is_upsert_local;
  pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *value_local;
  transaction_base *transaction_local;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *this_local;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents_local;
  index_pointer node_local;
  undefined1 local_10;
  
  result.addr_.a_._7_1_ = is_upsert;
  ppStack_40 = value;
  value_local = (pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> *)transaction;
  transaction_local = (transaction_base *)this;
  this_local = (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                *)parents.ptr_;
  parents_local.ptr_ = (array_stack<pstore::index::details::parent_type,_13UL> *)node;
  details::index_pointer::index_pointer((index_pointer *)&stack0xffffffffffffffb0);
  lptr.super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  std::shared_ptr<const_pstore::index::details::linear_node>::shared_ptr
            ((shared_ptr<const_pstore::index::details::linear_node> *)&orig_node);
  local_70 = (linear_node *)0x0;
  pdVar3 = transaction_base::db((transaction_base *)value_local);
  local_90 = parents_local.ptr_;
  details::linear_node::get_node(&local_88,pdVar3,(index_pointer)parents_local.ptr_);
  std::
  tie<std::shared_ptr<pstore::index::details::linear_node_const>,pstore::index::details::linear_node_const*>
            ((shared_ptr<const_pstore::index::details::linear_node> *)&child_slot.addr_,&orig_node);
  std::
  tuple<std::shared_ptr<pstore::index::details::linear_node_const>&,pstore::index::details::linear_node_const*&>
  ::operator=((tuple<std::shared_ptr<pstore::index::details::linear_node_const>&,pstore::index::details::linear_node_const*&>
               *)&child_slot.addr_,&local_88);
  std::
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  ::~pair(&local_88);
  if (local_70 == (linear_node *)0x0) {
    assert_failed("orig_node != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0x368);
  }
  details::index_pointer::index_pointer((index_pointer *)&index);
  plVar1 = local_70;
  local_c0 = 0;
  pdVar3 = transaction_base::db((transaction_base *)value_local);
  local_d0 = details::linear_node::
             lookup<pstore::uint128,pstore::uint128,std::equal_to<pstore::uint128>,void>
                       (plVar1,pdVar3,ppStack_40);
  std::tie<pstore::index::details::index_pointer,unsigned_long>((index_pointer *)&new_node,&index);
  std::tuple<pstore::index::details::index_pointer&,unsigned_long&>::operator=
            ((tuple<pstore::index::details::index_pointer&,unsigned_long&> *)&new_node,&local_d0);
  if (local_c0 == 0xffffffffffffffff) {
    details::linear_node::allocate_from((linear_node *)local_f0,local_70,1);
    local_c0 = details::linear_node::size(local_70);
    new_node_1._M_t.
    super___uniq_ptr_impl<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::index::details::linear_node_*,_std::default_delete<pstore::index::details::linear_node>_>
    .super__Head_base<0UL,_pstore::index::details::linear_node_*,_false>._M_head_impl =
         (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
          )(__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
            )this_local;
    aVar4 = store_leaf_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                      (this,(transaction_base *)value_local,ppStack_40,
                       (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>)
                       this_local);
    this_00 = std::
              unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
              ::operator*((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                           *)local_f0);
    paVar5 = details::linear_node::operator[](this_00,local_c0);
    paVar5->a_ = aVar4.a_;
    l = std::
        unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
        ::release((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                   *)local_f0);
    details::index_pointer::operator=((index_pointer *)&stack0xffffffffffffffb0,l);
    std::
    unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
    ::~unique_ptr((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                   *)local_f0);
  }
  else {
    lptr.super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = 1;
    if ((result.addr_.a_._7_1_ & 1) == 0) {
      paVar6 = gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
               operator->((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                           *)&this_local);
      local_148 = (value_type)details::linear_node::operator[](local_70,local_c0);
      details::index_pointer::index_pointer((index_pointer *)&local_140.addr_,(address)local_148);
      details::parent_type::parent_type(&local_138,local_140,0xffffffffffffffff);
      array_stack<pstore::index::details::parent_type,_13UL>::push(paVar6,&local_138);
      iStack_50.addr_.a_ = (address)(address)parents_local.ptr_;
    }
    else {
      std::
      unique_ptr<pstore::index::details::linear_node,std::default_delete<pstore::index::details::linear_node>>
      ::unique_ptr<std::default_delete<pstore::index::details::linear_node>,void>
                ((unique_ptr<pstore::index::details::linear_node,std::default_delete<pstore::index::details::linear_node>>
                  *)&lnode);
      local_118._8_8_ = 0;
      bVar2 = details::index_pointer::is_heap((index_pointer *)&parents_local);
      if (bVar2) {
        local_118._8_8_ =
             details::index_pointer::untag<pstore::index::details::linear_node*,void>
                       ((index_pointer *)&parents_local);
        iStack_50.addr_.a_ = (address)(address)parents_local.ptr_;
      }
      else {
        details::linear_node::allocate_from((linear_node *)local_118,local_70,0);
        std::
        unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
        ::operator=((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                     *)&lnode,
                    (unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                     *)local_118);
        std::
        unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
        ::~unique_ptr((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                       *)local_118);
        local_118._8_8_ =
             std::
             unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
             ::get((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                    *)&lnode);
        details::index_pointer::operator=
                  ((index_pointer *)&stack0xffffffffffffffb0,(linear_node *)local_118._8_8_);
      }
      local_128 = this_local;
      local_120 = (value_type)
                  store_leaf_node<std::pair<pstore::uint128,pstore::extent<pstore::repo::fragment>>>
                            (this,(transaction_base *)value_local,ppStack_40,
                             (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                              )this_local);
      paVar5 = details::linear_node::operator[]((linear_node *)local_118._8_8_,local_c0);
      paVar5->a_ = local_120;
      std::
      unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
      ::release((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                 *)&lnode);
      std::
      unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
      ::~unique_ptr((unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
                     *)&lnode);
    }
  }
  paVar6 = gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
           operator->((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> *)
                      &this_local);
  details::parent_type::parent_type(&local_158,iStack_50,local_c0);
  array_stack<pstore::index::details::parent_type,_13UL>::push(paVar6,&local_158);
  std::pair<pstore::index::details::index_pointer,_bool>::
  pair<pstore::index::details::index_pointer_&,_bool_&,_true>
            ((pair<pstore::index::details::index_pointer,_bool> *)&node_local.addr_,
             &stack0xffffffffffffffb0,
             (bool *)((long)&lptr.
                             super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
  std::shared_ptr<const_pstore::index::details::linear_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::linear_node> *)&orig_node);
  pVar7._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar7.second = (bool)local_10;
  pVar7.first.internal_ = node_local.internal_;
  return pVar7;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_into_linear (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            gsl::not_null<parent_stack *> parents, bool const is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;

            std::shared_ptr<linear_node const> lptr;
            linear_node const * orig_node = nullptr;
            std::tie (lptr, orig_node) = linear_node::get_node (transaction.db (), node);
            PSTORE_ASSERT (orig_node != nullptr);

            index_pointer child_slot;
            auto index = std::size_t{0};

            std::tie (child_slot, index) =
                orig_node->lookup<KeyType> (transaction.db (), value.first, equal_);
            if (index == details::not_found) {
                // The key wasn't present in the node so we simply append it.
                // TODO: keep these entries sorted?

                // Load into memory with space for 1 new child node.
                std::unique_ptr<linear_node> new_node = linear_node::allocate_from (*orig_node, 1U);
                index = orig_node->size ();
                (*new_node)[index] = this->store_leaf_node (transaction, value, parents);
                result = new_node.release ();
            } else {
                key_exists = true;
                if (is_upsert) {
                    std::unique_ptr<linear_node> new_node;
                    linear_node * lnode = nullptr;

                    if (node.is_heap ()) {
                        // If the node is already on the heap then there's no need to reallocate it.
                        lnode = node.untag<linear_node *> ();
                        result = node;
                    } else {
                        // Load into memory but no extra space.
                        new_node = linear_node::allocate_from (*orig_node, 0U);
                        lnode = new_node.get ();
                        result = lnode;
                    }
                    (*lnode)[index] = this->store_leaf_node (transaction, value, parents);
                    new_node.release ();
                } else {
                    parents->push (details::parent_type{index_pointer{(*orig_node)[index]}});

                    // We didn't modify the node so our return value is the original node index
                    // pointer.
                    result = node;
                }
            }

            parents->push (details::parent_type{result, index});
            return {result, key_exists};
        }